

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void ntileValueFunc(sqlite3_context *pCtx)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  Mem *pMem;
  
  if ((short)pCtx->pMem->flags < 0) {
    plVar3 = (long *)pCtx->pMem->z;
  }
  else {
    plVar3 = (long *)createAggContext(pCtx,0x18);
  }
  if (plVar3 == (long *)0x0) {
    return;
  }
  lVar5 = plVar3[1];
  if (lVar5 < 1) {
    return;
  }
  iVar2 = (int)(*plVar3 / lVar5);
  if (iVar2 == 0) {
    lVar5 = plVar3[2];
  }
  else {
    lVar5 = *plVar3 - lVar5 * iVar2;
    lVar4 = lVar5 * (iVar2 + 1);
    lVar1 = plVar3[2];
    if (lVar1 < lVar4) {
      lVar5 = lVar1 / (long)(iVar2 + 1) + 1;
      pMem = pCtx->pOut;
      if ((pMem->flags & 0x9000) != 0) goto LAB_001b5003;
      (pMem->u).i = lVar5;
      goto LAB_001b5011;
    }
    lVar5 = lVar5 + (lVar1 - lVar4) / (long)iVar2;
  }
  lVar5 = lVar5 + 1;
  pMem = pCtx->pOut;
  if ((pMem->flags & 0x9000) != 0) {
LAB_001b5003:
    vdbeReleaseAndSetInt64(pMem,lVar5);
    return;
  }
  (pMem->u).i = lVar5;
LAB_001b5011:
  pMem->flags = 4;
  return;
}

Assistant:

static void ntileValueFunc(sqlite3_context *pCtx){
  struct NtileCtx *p;
  p = (struct NtileCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->nParam>0 ){
    int nSize = (p->nTotal / p->nParam);
    if( nSize==0 ){
      sqlite3_result_int64(pCtx, p->iRow+1);
    }else{
      i64 nLarge = p->nTotal - p->nParam*nSize;
      i64 iSmall = nLarge*(nSize+1);
      i64 iRow = p->iRow;

      assert( (nLarge*(nSize+1) + (p->nParam-nLarge)*nSize)==p->nTotal );

      if( iRow<iSmall ){
        sqlite3_result_int64(pCtx, 1 + iRow/(nSize+1));
      }else{
        sqlite3_result_int64(pCtx, 1 + nLarge + (iRow-iSmall)/nSize);
      }
    }
  }
}